

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  pointer ppvVar1;
  DescriptorIndex *__ptr;
  pointer ppvVar2;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_00570538;
  ppvVar2 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar1 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppvVar2 != ppvVar1) {
    do {
      operator_delete(*ppvVar2);
      ppvVar2 = ppvVar2 + 1;
    } while (ppvVar2 != ppvVar1);
    ppvVar2 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2,(long)(this->files_to_delete_).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar2);
  }
  __ptr = (this->index_)._M_t.
          super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
          .
          super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
          ._M_head_impl;
  if (__ptr != (DescriptorIndex *)0x0) {
    std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>::operator()
              ((default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex> *)
               &this->index_,__ptr);
  }
  (this->index_)._M_t.
  super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  .super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>.
  _M_head_impl = (DescriptorIndex *)0x0;
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}